

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::anon_unknown_36::WebSocketPipeImpl::abort(WebSocketPipeImpl *this)

{
  WebSocket *pWVar1;
  PromiseFulfiller<void> *pPVar2;
  Own<kj::WebSocket,_std::nullptr_t> local_38;
  Own<kj::(anonymous_namespace)::WebSocketPipeImpl::Aborted,_std::nullptr_t> local_20;
  
  pWVar1 = (this->state).ptr;
  if (pWVar1 != (WebSocket *)0x0) {
    (*pWVar1->_vptr_WebSocket[4])();
    return;
  }
  local_38.ptr = (WebSocket *)operator_new(8);
  (local_38.ptr)->_vptr_WebSocket = (_func_int **)&PTR_send_0066d9a0;
  local_20.disposer =
       (Disposer *)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::WebSocketPipeImpl::Aborted>::instance;
  local_38.disposer =
       (Disposer *)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::WebSocketPipeImpl::Aborted>::instance;
  local_20.ptr = (Aborted *)0x0;
  Own<kj::WebSocket,_std::nullptr_t>::operator=(&this->ownState,&local_38);
  Own<kj::WebSocket,_std::nullptr_t>::dispose(&local_38);
  Own<kj::(anonymous_namespace)::WebSocketPipeImpl::Aborted,_std::nullptr_t>::~Own(&local_20);
  pPVar2 = (this->abortedFulfiller).ptr.ptr;
  (this->state).ptr = (this->ownState).ptr;
  this->aborted = true;
  if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
    (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar2,&local_38);
    local_38.disposer = (Disposer *)0x0;
    local_38.ptr = (WebSocket *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              (&(this->abortedFulfiller).ptr,
               (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_38);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_38);
  }
  return;
}

Assistant:

void abort() override {
    KJ_IF_SOME(s, state) {
      s.abort();
    } else {
      ownState = heap<Aborted>();
      state = *ownState;

      aborted = true;
      KJ_IF_SOME(f, abortedFulfiller) {
        f->fulfill();
        abortedFulfiller = kj::none;
      }
    }